

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void duckdb::ReservoirQuantileListOperation<short>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<short>>
               (ReservoirQuantileState<short> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  FunctionData *pFVar2;
  data_ptr_t pdVar3;
  short *psVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  Vector *pVVar7;
  idx_t iVar8;
  reference pvVar9;
  ulong uVar10;
  size_type __n;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar2 = (this->bind_data).ptr;
    pVVar7 = ListVector::GetEntry(finalize_data->result);
    iVar8 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData >>
                        3) + iVar8);
    pdVar3 = pVVar7->data;
    psVar4 = state->v;
    target->offset = iVar8;
    pp_Var5 = pFVar2[2]._vptr_FunctionData;
    pp_Var6 = pFVar2[1]._vptr_FunctionData;
    uVar11 = (long)pp_Var5 - (long)pp_Var6 >> 3;
    target->length = uVar11;
    if (pp_Var5 != pp_Var6) {
      __n = 0;
      do {
        pvVar9 = vector<double,_true>::operator[]((vector<double,_true> *)(pFVar2 + 1),__n);
        uVar11 = state->pos;
        lVar1 = uVar11 - 1;
        auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar12._0_8_ = lVar1;
        auVar12._12_4_ = 0x45300000;
        dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * *pvVar9;
        uVar10 = (ulong)dVar13;
        uVar10 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
        if ((uVar11 != 0) && (uVar11 != uVar10)) {
          lVar1 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          ::std::__introselect<short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (psVar4,psVar4 + uVar10,psVar4 + uVar11,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        }
        *(short *)(pdVar3 + __n * 2 + iVar8 * 2) = psVar4[uVar10];
        __n = __n + 1;
        uVar11 = target->length;
      } while (__n < uVar11);
    }
    ListVector::SetListSize(finalize_data->result,uVar11 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}